

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFieldMask
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  byte *pbVar2;
  size_type *psVar3;
  _Alloc_hider _Var4;
  uint size;
  int iVar5;
  uint32 uVar6;
  Field *pFVar7;
  int64 iVar8;
  uint32 uVar9;
  undefined8 uVar10;
  CodedInputStream *pCVar11;
  ConverterCallback *pCVar12;
  uint32 tag;
  StringPiece path;
  StringPiece error_message;
  string local_d8;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  Type *local_98;
  ConverterCallback *local_90;
  long *local_88;
  Type *local_80;
  size_type *local_78;
  string combined;
  string str;
  
  local_88 = (long *)field_name.length_;
  pCVar12 = (ConverterCallback *)field_name.ptr_;
  local_78 = &combined._M_string_length;
  combined._M_dataplus._M_p = (pointer)0x0;
  combined._M_string_length._0_1_ = 0;
  pCVar11 = this->stream_;
  pbVar2 = pCVar11->buffer_;
  local_98 = (Type *)os;
  local_90 = pCVar12;
  local_80 = type;
  str.field_2._8_8_ = __return_storage_ptr__;
  if (pbVar2 < pCVar11->buffer_end_) {
    uVar6 = (uint32)*pbVar2;
    if (-1 < (char)*pbVar2) {
      pCVar11->buffer_ = pbVar2 + 1;
      uVar10 = __return_storage_ptr__;
      goto LAB_00317daf;
    }
  }
  else {
    uVar6 = 0;
  }
  uVar10 = pCVar11;
  uVar6 = io::CodedInputStream::ReadTagFallback(pCVar11,uVar6);
LAB_00317daf:
  pCVar11->last_tag_ = uVar6;
  if (uVar6 != 0) {
    uVar9 = 0;
    do {
      tag = uVar6;
      if (uVar9 == 0) {
        pFVar7 = FindAndVerifyField((ProtoStreamObjectSource *)uVar10,local_98,tag);
        uVar9 = 0;
        if ((pFVar7 != (Field *)0x0) && (pFVar7->number_ == 1)) {
          iVar5 = std::__cxx11::string::compare((char *)(pFVar7->name_).ptr_);
          uVar9 = 0;
          if (iVar5 == 0) {
            uVar9 = tag;
          }
        }
      }
      uVar10 = str.field_2._8_8_;
      if (uVar9 != tag) {
        error_message.length_ = 0x24;
        error_message.ptr_ = "Invalid FieldMask, unexpected field.";
        Status::Status((Status *)str.field_2._8_8_,INTERNAL,error_message);
        goto LAB_00317fc8;
      }
      str._M_dataplus._M_p = (pointer)0x0;
      str._M_string_length._0_1_ = 0;
      pCVar11 = this->stream_;
      pbVar2 = pCVar11->buffer_;
      combined.field_2._8_8_ = &str._M_string_length;
      if (pbVar2 < pCVar11->buffer_end_) {
        bVar1 = *pbVar2;
        size = (uint)bVar1;
        uVar6 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00317e3d;
        pCVar11->buffer_ = pbVar2 + 1;
      }
      else {
        uVar6 = 0;
LAB_00317e3d:
        iVar8 = io::CodedInputStream::ReadVarint32Fallback(pCVar11,uVar6);
        size = (uint)iVar8;
        pCVar11 = this->stream_;
      }
      io::CodedInputStream::ReadString(pCVar11,(string *)((long)&combined.field_2 + 8),size);
      if (combined._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::append((char *)&local_78);
      }
      _Var4._M_p = str._M_dataplus._M_p;
      uVar10 = combined.field_2._8_8_;
      if ((long)str._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)str._M_dataplus._M_p,"size_t to int conversion");
      }
      local_b0 = 0;
      local_b8 = ToCamelCase_abi_cxx11_;
      local_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
                 ::_M_invoke;
      local_a8 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
                 ::_M_manager;
      path.length_ = (stringpiece_ssize_type)&local_b8;
      path.ptr_ = _Var4._M_p;
      ConvertFieldMaskPath(&local_d8,(converter *)uVar10,path,pCVar12);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,3);
      }
      uVar10 = combined.field_2._8_8_;
      if ((size_type *)combined.field_2._8_8_ != &str._M_string_length) {
        operator_delete((void *)combined.field_2._8_8_);
      }
      pCVar11 = this->stream_;
      pbVar2 = pCVar11->buffer_;
      if (pbVar2 < pCVar11->buffer_end_) {
        bVar1 = *pbVar2;
        uVar6 = (uint32)bVar1;
        uVar9 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00317f48;
        pCVar11->buffer_ = pbVar2 + 1;
      }
      else {
        uVar9 = 0;
LAB_00317f48:
        uVar10 = pCVar11;
        uVar6 = io::CodedInputStream::ReadTagFallback(pCVar11,uVar9);
      }
      pCVar11->last_tag_ = uVar6;
      uVar9 = tag;
    } while (uVar6 != 0);
  }
  uVar10 = str.field_2._8_8_;
  _Var4._M_p = combined._M_dataplus._M_p;
  psVar3 = local_78;
  pCVar12 = local_90;
  if ((long)combined._M_dataplus._M_p < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)combined._M_dataplus._M_p,"size_t to int conversion");
  }
  (**(code **)(*local_88 + 0x68))(local_88,local_80,pCVar12,psVar3,_Var4._M_p);
  Status::Status((Status *)uVar10);
LAB_00317fc8:
  if (local_78 != &combined._M_string_length) {
    operator_delete(local_78);
  }
  return (Status *)uVar10;
}

Assistant:

Status ProtoStreamObjectSource::RenderFieldMask(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  std::string combined;
  uint32 buffer32;
  uint32 paths_field_tag = 0;
  for (uint32 tag = os->stream_->ReadTag(); tag != 0;
       tag = os->stream_->ReadTag()) {
    if (paths_field_tag == 0) {
      const google::protobuf::Field* field = os->FindAndVerifyField(type, tag);
      if (field != nullptr && field->number() == 1 &&
          field->name() == "paths") {
        paths_field_tag = tag;
      }
    }
    if (paths_field_tag != tag) {
      return util::Status(util::error::INTERNAL,
                          "Invalid FieldMask, unexpected field.");
    }
    std::string str;
    os->stream_->ReadVarint32(&buffer32);  // string size.
    os->stream_->ReadString(&str, buffer32);
    if (!combined.empty()) {
      combined.append(",");
    }
    combined.append(ConvertFieldMaskPath(str, &ToCamelCase));
  }
  ow->RenderString(field_name, combined);
  return util::Status();
}